

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall nonius::junit_reporter::do_suite_complete(junit_reporter *this)

{
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *pfVar1;
  _Manager_type p_Var2;
  bool bVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_true>
  __it;
  _Hash_node_base *p_Var6;
  long lVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  tc;
  void *local_128;
  string local_120 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  local_d0;
  
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\ngenerating JUnit report\n",0x19);
  }
  if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &(this->super_reporter).os;
    pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (pbVar4,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n",0x27);
    if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
      pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
      std::__ostream_insert<char,std::char_traits<char>>(pbVar4,"<testsuite name=\"",0x11);
      escape(&local_d0.first,&this->title);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (pbVar4,local_d0.first._M_dataplus._M_p,local_d0.first._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" tests=\"",9);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.first._M_dataplus._M_p != &local_d0.first.field_2) {
        operator_delete(local_d0.first._M_dataplus._M_p,
                        local_d0.first.field_2._M_allocated_capacity + 1);
      }
      __it._M_cur = (__node_type *)(this->data)._M_h._M_before_begin._M_nxt;
      lVar7 = 0;
      if (__it._M_cur != (__node_type *)0x0) {
        do {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<nonius::junit_reporter::do_suite_complete()::{lambda(std::pair<std::__cxx11::string_const&,nonius::junit_reporter::result>const&)#1}>
                  ::operator()((_Iter_pred<nonius::junit_reporter::do_suite_complete()::_lambda(std::pair<std::__cxx11::string_const&,nonius::junit_reporter::result>const&)_1_>
                                *)&local_d0,
                               (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_false,_true>
                                )__it._M_cur);
          lVar7 = lVar7 + (ulong)bVar3;
          __it._M_cur = *__it._M_cur;
        } while (__it._M_cur != (__node_type *)0x0);
      }
      if (0 < lVar7) {
        if ((this->super_reporter).os.super__Function_base._M_manager == (_Manager_type)0x0)
        goto LAB_001422d7;
        pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar4," errors=\"",9);
        poVar5 = std::ostream::_M_insert<long>((long)pbVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      }
      if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
        pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar4,">\n",2);
        if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
          pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
          std::__ostream_insert<char,std::char_traits<char>>(pbVar4," <properties>\n",0xe);
          if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
            pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (pbVar4,"  <property name=\"samples\" value=\"",0x22);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)pbVar4,this->n_samples);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\">\n",3);
            if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
              pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pbVar4,"  <property name=\"confidence_interval\" value=\"",0x2e);
              *(undefined8 *)(pbVar4 + *(long *)(*(long *)pbVar4 + -0x18) + 8) = 3;
              poVar5 = std::ostream::_M_insert<double>(this->confidence_interval);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\">\n",3);
              if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
                pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pbVar4,"  <property name=\"resamples\" value=\"",0x24);
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)pbVar4,this->resamples);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\">\n",3);
                if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0)
                {
                  pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                  std::__ostream_insert<char,std::char_traits<char>>(pbVar4," </properties>\n",0xf);
                  p_Var6 = (this->data)._M_h._M_before_begin._M_nxt;
                  if (p_Var6 != (_Hash_node_base *)0x0) {
                    do {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
                      ::pair(&local_d0,
                             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
                              *)(p_Var6 + 1));
                      if ((this->super_reporter).os.super__Function_base._M_manager ==
                          (_Manager_type)0x0) {
LAB_001422d2:
                        std::__throw_bad_function_call();
                      }
                      pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (pbVar4," <testcase name=\"",0x11);
                      escape(local_120,&local_d0.first);
                      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                         (pbVar4,local_120[0]._M_dataplus._M_p,
                                          local_120[0]._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_120[0]._M_dataplus._M_p != &local_120[0].field_2) {
                        operator_delete(local_120[0]._M_dataplus._M_p,
                                        local_120[0].field_2._M_allocated_capacity + 1);
                      }
                      p_Var2 = (this->super_reporter).os.super__Function_base._M_manager;
                      if (local_d0.second.failure._M_exception_object != (void *)0x0) {
                        if (p_Var2 != (_Manager_type)0x0) {
                          pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                          std::__ostream_insert<char,std::char_traits<char>>(pbVar4,">\n",2);
                          local_128 = local_d0.second.failure._M_exception_object;
                          if (local_d0.second.failure._M_exception_object != (void *)0x0) {
                            std::__exception_ptr::exception_ptr::_M_addref();
                          }
                          std::rethrow_exception((exception_ptr)&local_128);
                          std::__throw_bad_function_call();
                        }
                        goto LAB_001422d2;
                      }
                      if (p_Var2 == (_Manager_type)0x0) goto LAB_001422d2;
                      pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                      *(uint *)(pbVar4 + *(long *)(*(long *)pbVar4 + -0x18) + 0x18) =
                           *(uint *)(pbVar4 + *(long *)(*(long *)pbVar4 + -0x18) + 0x18) &
                           0xfffffefb | 4;
                      if ((this->super_reporter).os.super__Function_base._M_manager ==
                          (_Manager_type)0x0) goto LAB_001422d2;
                      pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                      *(undefined8 *)(pbVar4 + *(long *)(*(long *)pbVar4 + -0x18) + 8) = 0xf;
                      if ((this->super_reporter).os.super__Function_base._M_manager ==
                          (_Manager_type)0x0) goto LAB_001422d2;
                      pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                      std::__ostream_insert<char,std::char_traits<char>>(pbVar4," time=\"",7);
                      poVar5 = std::ostream::_M_insert<double>
                                         (local_d0.second.analysis.mean.point.__r);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" />\n",5);
                      if (local_d0.second.failure._M_exception_object != (void *)0x0) {
                        std::__exception_ptr::exception_ptr::_M_release();
                      }
                      if (local_d0.second.analysis.samples.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_d0.second.analysis.samples.
                                        super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_d0.second.analysis.samples.
                                              super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_d0.second.analysis.samples.
                                              super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d0.first._M_dataplus._M_p != &local_d0.first.field_2) {
                        operator_delete(local_d0.first._M_dataplus._M_p,
                                        local_d0.first.field_2._M_allocated_capacity + 1);
                      }
                      p_Var6 = p_Var6->_M_nxt;
                    } while (p_Var6 != (_Hash_node_base *)0x0);
                  }
                  if ((this->super_reporter).os.super__Function_base._M_manager !=
                      (_Manager_type)0x0) {
                    pbVar4 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                    std::__ostream_insert<char,std::char_traits<char>>(pbVar4,"</testsuite>\n",0xd);
                    if ((this->super_reporter).os.super__Function_base._M_manager !=
                        (_Manager_type)0x0) {
                      (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                      std::ostream::flush();
                      if (this->verbose != false) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"done\n",5);
                      }
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001422d7:
  std::__throw_bad_function_call();
}

Assistant:

void do_suite_complete() override {
            if(verbose) progress_stream() << "\ngenerating JUnit report\n";

            report_stream() << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n";
            report_stream() << "<testsuite name=\"" << escape(title) << "\" tests=\"" << data.size() << "\"";
            auto failures = std::count_if(data.begin(), data.end(),
                    [](std::pair<std::string const&, result> const& p) {
                        return static_cast<bool>(p.second.failure);
                    });
            if(failures > 0) report_stream() << " errors=\"" << failures << "\"";
            report_stream() << ">\n";

            report_stream() << " <properties>\n";
            report_stream() << "  <property name=\"samples\" value=\"" << n_samples << "\">\n";
            report_stream() << "  <property name=\"confidence_interval\" value=\"" << std::setprecision(3) << confidence_interval << "\">\n";
            report_stream() << "  <property name=\"resamples\" value=\"" << resamples << "\">\n";
            report_stream() << " </properties>\n";

            for(auto tc : data) {
                report_stream() << " <testcase name=\"" << escape(tc.first) << "\"";
                if(tc.second.failure) {
                    report_stream() << ">\n";
                    try {
                        std::rethrow_exception(tc.second.failure);
                    } catch(std::exception const& e) {
                        report_stream() << "  <error message=\"" << escape(e.what()) << "\" />\n";
                    } catch(...) {
                        report_stream() << "  <error message=\"unknown error\" />\n";
                    }
                    report_stream() << " </testcase>\n";
                } else {
                    report_stream() << std::fixed;
                    report_stream().precision(std::numeric_limits<double>::digits10);
                    report_stream() << " time=\"" << tc.second.analysis.mean.point.count() << "\" />\n";
                }
            }

            report_stream() << "</testsuite>\n";

            report_stream() << std::flush;

            if(verbose) progress_stream() << "done\n";
        }